

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O2

bool bssl::marshal_CA_names
               (stack_st_CRYPTO_BUFFER *config_names,stack_st_CRYPTO_BUFFER *ctx_names,CBB *cbb)

{
  StackIterator<stack_st_CRYPTO_BUFFER> SVar1;
  int iVar2;
  Type *buf;
  uint8_t *data;
  size_t sVar3;
  bool bVar4;
  StackIterator<stack_st_CRYPTO_BUFFER> SVar5;
  StackIterator<stack_st_CRYPTO_BUFFER> __begin1;
  CBB child;
  CBB name_cbb;
  StackIteratorImpl<stack_st_CRYPTO_BUFFER> local_a0;
  CBB local_90;
  CBB local_60;
  
  if (config_names != (stack_st_CRYPTO_BUFFER *)0x0) {
    ctx_names = config_names;
  }
  iVar2 = CBB_add_u16_length_prefixed(cbb,&local_90);
  if (iVar2 == 0) {
LAB_00149060:
    bVar4 = false;
  }
  else {
    if (ctx_names != (stack_st_CRYPTO_BUFFER *)0x0) {
      local_a0.idx_ = 0;
      local_a0.sk_ = ctx_names;
      SVar5 = end<stack_st_CRYPTO_BUFFER>(ctx_names);
      sVar3 = 0;
      while (SVar1.idx_ = sVar3, SVar1.sk_ = ctx_names, SVar5 != SVar1) {
        buf = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator*(&local_a0);
        iVar2 = CBB_add_u16_length_prefixed(&local_90,&local_60);
        if (iVar2 == 0) goto LAB_00149060;
        data = CRYPTO_BUFFER_data(buf);
        sVar3 = CRYPTO_BUFFER_len(buf);
        iVar2 = CBB_add_bytes(&local_60,data,sVar3);
        if (iVar2 == 0) goto LAB_00149060;
        sVar3 = local_a0.idx_ + 1;
        ctx_names = local_a0.sk_;
        local_a0.idx_ = sVar3;
      }
    }
    iVar2 = CBB_flush(cbb);
    bVar4 = iVar2 != 0;
  }
  return bVar4;
}

Assistant:

static bool marshal_CA_names(const STACK_OF(CRYPTO_BUFFER) *config_names,
                             const STACK_OF(CRYPTO_BUFFER) *ctx_names,
                             CBB *cbb) {
  const STACK_OF(CRYPTO_BUFFER) *names =
      config_names == nullptr ? ctx_names : config_names;
  CBB child, name_cbb;

  if (!CBB_add_u16_length_prefixed(cbb, &child)) {
    return false;
  }

  if (names == nullptr) {
    return CBB_flush(cbb);
  }

  for (const CRYPTO_BUFFER *name : names) {
    if (!CBB_add_u16_length_prefixed(&child, &name_cbb) ||
        !CBB_add_bytes(&name_cbb, CRYPTO_BUFFER_data(name),
                       CRYPTO_BUFFER_len(name))) {
      return false;
    }
  }

  return CBB_flush(cbb);
}